

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::BitstringAggBindData::Deserialize(Deserializer *deserializer,AggregateFunction *param_2)

{
  unique_ptr<duckdb::BitstringAggBindData,_std::default_delete<duckdb::BitstringAggBindData>_>
  *in_RDI;
  Value max;
  Value min;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> this;
  LogicalType *type;
  Value *in_stack_ffffffffffffff20;
  LogicalTypeId in_stack_ffffffffffffff2f;
  LogicalType *in_stack_ffffffffffffff30;
  Value *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  field_id_t in_stack_ffffffffffffff5e;
  Deserializer *in_stack_ffffffffffffff60;
  LogicalType local_70;
  Value *in_stack_ffffffffffffffb0;
  Value *in_stack_ffffffffffffffb8;
  
  type = &local_70;
  this._M_head_impl = (FunctionData *)in_RDI;
  LogicalType::LogicalType(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2f);
  Value::Value(in_stack_ffffffffffffff20,type);
  LogicalType::~LogicalType((LogicalType *)0x1c94463);
  LogicalType::LogicalType(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2f);
  Value::Value(in_stack_ffffffffffffff20,type);
  LogicalType::~LogicalType((LogicalType *)0x1c9448f);
  Deserializer::ReadProperty<duckdb::Value>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5e,in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48);
  Deserializer::ReadProperty<duckdb::Value>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5e,in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48);
  make_uniq<duckdb::BitstringAggBindData,duckdb::Value&,duckdb::Value&>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
  unique_ptr<duckdb::BitstringAggBindData,std::default_delete<std::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>>>,void>
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             this._M_head_impl,in_RDI);
  unique_ptr<duckdb::BitstringAggBindData,_std::default_delete<duckdb::BitstringAggBindData>,_true>
  ::~unique_ptr((unique_ptr<duckdb::BitstringAggBindData,_std::default_delete<duckdb::BitstringAggBindData>,_true>
                 *)0x1c94503);
  Value::~Value((Value *)this._M_head_impl);
  Value::~Value((Value *)this._M_head_impl);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
         this._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> Deserialize(Deserializer &deserializer, AggregateFunction &) {
		Value min;
		Value max;
		deserializer.ReadProperty(100, "min", min);
		deserializer.ReadProperty(101, "max", max);
		return make_uniq<BitstringAggBindData>(min, max);
	}